

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::WeightParams::ByteSizeLong(WeightParams *this)

{
  long lVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar6 = (ulong)(uint)(this->floatvalue_).current_size_;
  lVar1 = uVar6 * 4;
  uVar5 = (uint)lVar1;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else if ((int)uVar5 < 0) {
    uVar6 = 0xb;
  }
  else {
    iVar3 = 0x1f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar6 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
  }
  this->_floatvalue_cached_byte_size_ = uVar5;
  sVar7 = uVar6 + lVar1;
  sVar2 = ((this->float16value_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar5 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = ((this->rawvalue_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar5 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = ((this->int8rawvalue_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar5 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar7 = sVar7 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)&_WeightParams_default_instance_) {
    sVar4 = QuantizationParams::ByteSizeLong(this->quantization_);
    uVar5 = (uint)sVar4 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar7 = sVar7 + sVar4 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  sVar4 = sVar7 + 3;
  if (this->isupdatable_ == false) {
    sVar4 = sVar7;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t WeightParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.WeightParams)
  size_t total_size = 0;

  // repeated float floatValue = 1;
  {
    unsigned int count = this->floatvalue_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _floatvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->float16value());
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->rawvalue());
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->int8rawvalue());
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->quantization_);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}